

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O0

void keymap_dump(ang_file *fff)

{
  undefined1 local_448 [8];
  keypress key [2];
  char local_428 [8];
  char buf [1024];
  keymap *local_20;
  keymap *k;
  int mode;
  ang_file *fff_local;
  
  k._4_4_ = (uint)(((player->opts).opt[1] & 1U) != 0);
  for (local_20 = keymaps[(int)k._4_4_]; local_20 != (keymap *)0x0; local_20 = local_20->next) {
    memset(local_448,0,0x18);
    if ((local_20->user & 1U) != 0) {
      keypress_to_text(local_428,0x400,local_20->actions,false);
      file_putf(fff,"keymap-act:%s\n",local_428);
      local_448._0_4_ = (local_20->key).type;
      local_448._4_4_ = (local_20->key).code;
      key[0].type = *(ui_event_type *)&(local_20->key).mods;
      keypress_to_text(local_428,0x400,(keypress *)local_448,true);
      file_putf(fff,"keymap-input:%d:%s\n",(ulong)k._4_4_);
      file_putf(fff,"\n");
    }
  }
  return;
}

Assistant:

void keymap_dump(ang_file *fff)
{
	int mode;
	struct keymap *k;

	if (OPT(player, rogue_like_commands))
		mode = KEYMAP_MODE_ROGUE;
	else
		mode = KEYMAP_MODE_ORIG;

	for (k = keymaps[mode]; k; k = k->next) {
		char buf[1024];
		struct keypress key[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

		if (!k->user) continue;

		/* Encode the action */
		keypress_to_text(buf, sizeof(buf), k->actions, false);
		file_putf(fff, "keymap-act:%s\n", buf);

		/* Convert the key into a string */
		key[0] = k->key;
		keypress_to_text(buf, sizeof(buf), key, true);
		file_putf(fff, "keymap-input:%d:%s\n", mode, buf);

		file_putf(fff, "\n");
	}
}